

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O0

char * coda_identifier_from_name(char *name,hashtable *hash_data)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  bool bVar5;
  uint local_3c;
  int local_38;
  int counter;
  int i;
  int length;
  char *identifier;
  int postfix_length;
  hashtable *hash_data_local;
  char *name_local;
  
  hash_data_local = (hashtable *)name;
  if (name == (char *)0x0) {
    hash_data_local = (hashtable *)anon_var_dwarf_13f94;
  }
  else {
    while( true ) {
      bVar5 = false;
      if (*(char *)&hash_data_local->count != '\0') {
        ppuVar3 = __ctype_b_loc();
        bVar5 = ((*ppuVar3)[(int)*(char *)&hash_data_local->count] & 0x400) == 0;
      }
      if (!bVar5) break;
      hash_data_local = (hashtable *)((long)&hash_data_local->count + 1);
    }
    if (*(char *)&hash_data_local->count == '\0') {
      hash_data_local = (hashtable *)anon_var_dwarf_13f94;
    }
  }
  sVar2 = strlen((char *)hash_data_local);
  iVar1 = (int)sVar2;
  name_local = (char *)malloc((long)(iVar1 + 5));
  if (name_local == (char *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",(long)(iVar1 + 4),
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                   ,0xac);
    name_local = (char *)0x0;
  }
  else {
    *name_local = *(char *)&hash_data_local->count;
    for (local_38 = 1; local_38 < iVar1; local_38 = local_38 + 1) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)*(char *)((long)&hash_data_local->count + (long)local_38)] & 8) == 0) {
        name_local[local_38] = '_';
      }
      else {
        name_local[local_38] = *(char *)((long)&hash_data_local->count + (long)local_38);
      }
    }
    name_local[iVar1] = '\0';
    if (hash_data != (hashtable *)0x0) {
      local_3c = 0;
      while (lVar4 = coda_hashtable_get_index_from_name(hash_data,name_local), -1 < lVar4) {
        local_3c = local_3c + 1;
        if (999 < (int)local_3c) {
          __assert_fail("counter < 1000",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                        ,0xcb,"char *coda_identifier_from_name(const char *, hashtable *)");
        }
        sprintf(name_local + iVar1,"_%d",(ulong)local_3c);
      }
    }
  }
  return name_local;
}

Assistant:

char *coda_identifier_from_name(const char *name, hashtable *hash_data)
{
    const int postfix_length = 4;
    char *identifier;
    int length;
    int i;

    if (name == NULL)
    {
        name = "unnamed";
    }
    else
    {
        /* strip leading non-alpha characters */
        while (*name != '\0' && !isalpha(*name))
        {
            name++;
        }
        if (*name == '\0')
        {
            name = "unnamed";
        }
    }

    length = (int)strlen(name);
    /* allow some space for _### postfixes */
    identifier = malloc(length + postfix_length + 1);
    if (identifier == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)(length + postfix_length), __FILE__, __LINE__);
        return NULL;
    }

    /* create identifier */

    /* first character is guaranteed to be an alpha character because of our previous test */
    identifier[0] = name[0];
    /* replace non-alphanumeric characters by a '_' */
    for (i = 1; i < length; i++)
    {
        if (isalnum(name[i]))
        {
            identifier[i] = name[i];
        }
        else
        {
            identifier[i] = '_';
        }
    }
    identifier[length] = '\0';

    /* check for double occurrences */
    if (hash_data != NULL)
    {
        int counter;

        counter = 0;
        while (hashtable_get_index_from_name(hash_data, identifier) >= 0)
        {
            counter++;
            assert(counter < 1000);
            sprintf(&identifier[length], "_%d", counter);
        }
    }

    return identifier;
}